

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O3

Builder * __thiscall
capnp::anon_unknown_0::MembraneCapTableBuilder::imbue
          (Builder *__return_storage_ptr__,MembraneCapTableBuilder *this,Builder builder)

{
  CapTableBuilder *pCVar1;
  PointerBuilder pointerBuilder;
  PointerBuilder local_50;
  PointerBuilder local_38;
  
  if (this->inner == (CapTableBuilder *)0x0) {
    local_38.pointer = builder.builder.pointer;
    local_38.segment = builder.builder.segment;
    local_38.capTable = builder.builder.capTable;
    pCVar1 = capnp::_::PointerBuilder::getCapTable(&local_38);
    this->inner = pCVar1;
    capnp::_::PointerBuilder::imbue(&local_50,&local_38,&this->super_CapTableBuilder);
    (__return_storage_ptr__->builder).pointer = local_50.pointer;
    (__return_storage_ptr__->builder).segment = local_50.segment;
    (__return_storage_ptr__->builder).capTable = local_50.capTable;
    return (Builder *)local_50.pointer;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
            ((Fault *)&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/membrane.c++"
             ,0x52,FAILED,"inner == nullptr","\"can only call this once\"",
             (char (*) [24])"can only call this once");
  kj::_::Debug::Fault::fatal((Fault *)&local_50);
}

Assistant:

AnyPointer::Builder imbue(AnyPointer::Builder builder) {
    KJ_REQUIRE(inner == nullptr, "can only call this once");
    auto pointerBuilder = _::PointerHelpers<AnyPointer>::getInternalBuilder(kj::mv(builder));
    inner = pointerBuilder.getCapTable();
    return AnyPointer::Builder(pointerBuilder.imbue(this));
  }